

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationDataBuilder::addContextTrie
          (CollationDataBuilder *this,uint32_t defaultCE32,UCharsTrieBuilder *trieBuilder,
          UErrorCode *errorCode)

{
  short sVar1;
  int32_t iVar2;
  UnicodeString *pUVar3;
  int srcLength;
  int srcStart;
  undefined4 uVar4;
  int32_t length;
  UnicodeString context;
  UnicodeString trieString;
  UnicodeString local_a8;
  UnicodeString local_68;
  
  local_a8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
  local_a8.fUnion.fStackFields.fLengthAndFlags = 2;
  local_68.super_Replaceable.super_UObject._vptr_UObject._0_2_ = (short)(defaultCE32 >> 0x10);
  pUVar3 = UnicodeString::doAppend(&local_a8,(UChar *)&local_68,0,1);
  local_68.super_Replaceable.super_UObject._vptr_UObject._0_2_ = (short)defaultCE32;
  UnicodeString::doAppend(pUVar3,(UChar *)&local_68,0,1);
  local_68.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
  local_68.fUnion.fStackFields.fLengthAndFlags = 2;
  pUVar3 = UCharsTrieBuilder::buildUnicodeString
                     (trieBuilder,USTRINGTRIE_BUILD_SMALL,&local_68,errorCode);
  sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (pUVar3->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  UnicodeString::doAppend(&local_a8,pUVar3,0,iVar2);
  iVar2 = -1;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (this->contexts).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (this->contexts).fUnion.fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    if ((local_a8.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      uVar4 = local_a8.fUnion.fFields.fLength;
      if (-1 < local_a8.fUnion.fStackFields.fLengthAndFlags) {
        uVar4 = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      srcStart = 0;
      if ((int)uVar4 < 0) {
        srcStart = uVar4;
      }
      srcLength = uVar4 - srcStart;
      if ((int)uVar4 <= uVar4 - srcStart) {
        srcLength = uVar4;
      }
      if ((int)uVar4 < 0) {
        srcLength = 0;
      }
      if (0 < srcLength) {
        if ((local_a8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_a8.fUnion.fFields.fArray = local_a8.fUnion.fStackFields.fBuffer;
        }
        iVar2 = UnicodeString::indexOf
                          (&this->contexts,local_a8.fUnion.fFields.fArray,srcStart,srcLength,0,
                           length);
      }
    }
    if (iVar2 < 0) {
      sVar1 = (this->contexts).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (this->contexts).fUnion.fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      if (-1 < local_a8.fUnion.fStackFields.fLengthAndFlags) {
        local_a8.fUnion.fFields.fLength = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doAppend(&this->contexts,&local_a8,0,local_a8.fUnion.fFields.fLength);
    }
  }
  UnicodeString::~UnicodeString(&local_68);
  UnicodeString::~UnicodeString(&local_a8);
  return iVar2;
}

Assistant:

int32_t
CollationDataBuilder::addContextTrie(uint32_t defaultCE32, UCharsTrieBuilder &trieBuilder,
                                     UErrorCode &errorCode) {
    UnicodeString context;
    context.append((UChar)(defaultCE32 >> 16)).append((UChar)defaultCE32);
    UnicodeString trieString;
    context.append(trieBuilder.buildUnicodeString(USTRINGTRIE_BUILD_SMALL, trieString, errorCode));
    if(U_FAILURE(errorCode)) { return -1; }
    int32_t index = contexts.indexOf(context);
    if(index < 0) {
        index = contexts.length();
        contexts.append(context);
    }
    return index;
}